

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Performance::LoopCase::deinit(LoopCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  LoopCase *this_local;
  
  iVar1 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  std::vector<float,_std::allocator<float>_>::clear(&this->m_boundArray);
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  deqp::gls::ShaderPerformanceCase::deinit((ShaderPerformanceCase *)this);
  return;
}

Assistant:

void LoopCase::deinit (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	m_boundArray.clear();

	if (m_arrayBuffer)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}

	ShaderPerformanceCase::deinit();
}